

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O3

int pkey_rsa_encrypt(EVP_PKEY_CTX *ctx,uint8_t *out,size_t *outlen,uint8_t *in,size_t inlen)

{
  RSA_PKEY_CTX *ctx_00;
  RSA *rsa;
  int iVar1;
  uint uVar2;
  ulong to_len;
  
  ctx_00 = (RSA_PKEY_CTX *)ctx->data;
  rsa = *(RSA **)&((EVP_PKEY *)ctx->pkey)->references;
  iVar1 = EVP_PKEY_size((EVP_PKEY *)ctx->pkey);
  to_len = (ulong)iVar1;
  if (out == (uint8_t *)0x0) {
    *outlen = to_len;
    uVar2 = 1;
  }
  else if (*outlen < to_len) {
    uVar2 = 0;
    ERR_put_error(6,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                  ,0x118);
  }
  else if (ctx_00->pad_mode == 4) {
    iVar1 = setup_tbuf(ctx_00,ctx);
    uVar2 = 0;
    if ((iVar1 != 0) &&
       (iVar1 = RSA_padding_add_PKCS1_OAEP_mgf1
                          (ctx_00->tbuf,to_len,in,inlen,ctx_00->oaep_label,ctx_00->oaep_labellen,
                           ctx_00->md,ctx_00->mgf1md), iVar1 != 0)) {
      iVar1 = RSA_encrypt(rsa,outlen,out,*outlen,ctx_00->tbuf,to_len,3);
      uVar2 = (uint)(iVar1 != 0);
    }
  }
  else {
    uVar2 = RSA_encrypt(rsa,outlen,out,*outlen,in,inlen,ctx_00->pad_mode);
  }
  return uVar2;
}

Assistant:

static int pkey_rsa_encrypt(EVP_PKEY_CTX *ctx, uint8_t *out, size_t *outlen,
                            const uint8_t *in, size_t inlen) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);
  RSA *rsa = reinterpret_cast<RSA *>(ctx->pkey->pkey);
  const size_t key_len = EVP_PKEY_size(ctx->pkey);

  if (!out) {
    *outlen = key_len;
    return 1;
  }

  if (*outlen < key_len) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (rctx->pad_mode == RSA_PKCS1_OAEP_PADDING) {
    if (!setup_tbuf(rctx, ctx) ||
        !RSA_padding_add_PKCS1_OAEP_mgf1(rctx->tbuf, key_len, in, inlen,
                                         rctx->oaep_label, rctx->oaep_labellen,
                                         rctx->md, rctx->mgf1md) ||
        !RSA_encrypt(rsa, outlen, out, *outlen, rctx->tbuf, key_len,
                     RSA_NO_PADDING)) {
      return 0;
    }
    return 1;
  }

  return RSA_encrypt(rsa, outlen, out, *outlen, in, inlen, rctx->pad_mode);
}